

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

void __thiscall
google::
sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
::sparse_hashtable(sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
                   *this,size_type expected_max_items_in_table,HashFn *hf,
                  equal_to<HashObject<4,_4>_> *eql,SelectKey *ext,SetKey *set,
                  libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_> *alloc)

{
  size_type sVar1;
  undefined1 local_11;
  
  (this->settings).super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  (this->settings).super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>.
  use_empty_ = false;
  (this->settings).super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>.
  use_deleted_ = false;
  (this->settings).super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  (this->settings).super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ = 0;
  (this->settings).super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 0;
  (this->settings).super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.8;
  (this->settings).super_sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.32;
  this->num_deleted = 0;
  if (expected_max_items_in_table == 0) {
    sVar1 = 0x20;
  }
  else {
    sVar1 = sparsehash_internal::sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>::
            min_buckets((sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4> *)this,
                        expected_max_items_in_table,0);
  }
  sparsetable<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
  ::sparsetable(&this->table,sVar1,&local_11);
  sparsehash_internal::sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4>::
  reset_thresholds((sh_hashtable_settings<HashObject<4,_4>,_HashFn,_unsigned_long,_4> *)this,
                   (this->table).settings.table_size);
  return;
}

Assistant:

explicit sparse_hashtable(size_type expected_max_items_in_table = 0,
                            const HashFcn& hf = HashFcn(),
                            const EqualKey& eql = EqualKey(),
                            const ExtractKey& ext = ExtractKey(),
                            const SetKey& set = SetKey(),
                            const Alloc& alloc = Alloc())
      : settings(hf),
        key_info(ext, set, eql),
        num_deleted(0),
        table((expected_max_items_in_table == 0
                   ? HT_DEFAULT_STARTING_BUCKETS
                   : settings.min_buckets(expected_max_items_in_table, 0)),
              alloc) {
    settings.reset_thresholds(bucket_count());
  }